

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  void *pvVar2;
  float *pfVar3;
  _func_int **pp_Var4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong __n;
  int K;
  int dim;
  uint32_t num_bases;
  float *query_data;
  float *base_data;
  uint32_t num_gts;
  uint32_t num_queries;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  result;
  L2Distance distance;
  HNSWIndex hnsw_index;
  uint32_t local_17c;
  uint32_t local_178;
  uint32_t local_174;
  float *local_170;
  PointSet local_168;
  long local_148;
  float *local_140;
  _func_int **local_138;
  float *local_130;
  uint local_128;
  uint local_124;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  local_120;
  Distance local_108;
  HNSWIndex local_f0;
  
  if (argc < 4) {
    __assert_fail("argc >= 4 && \"Usage: sift_test dataset_path query_path groundtruth_path index_path\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KinglittleQ[P]hnsw/tests/sift_test.cpp"
                  ,0x1c,"int main(int, char **)");
  }
  read_fvecs(argv[1],&local_130,&local_174,(int *)&local_178);
  read_fvecs(argv[2],&local_170,&local_124,(int *)&local_178);
  read_fvecs(argv[3],(float **)&local_f0,&local_128,(int *)&local_17c);
  __n = (ulong)local_124;
  if (local_128 == local_124) {
    local_108.dim_ = (size_t)(int)local_178;
    local_108.num = 0;
    local_108._vptr_Distance = (_func_int **)&PTR_operator___0010bcf8;
    hnsw::HNSWIndex::HNSWIndex(&local_f0,local_130,local_174,local_178,&local_108,0x20,0x28);
    if (argc == 5) {
      hnsw::HNSWIndex::LoadIndex(&local_f0,argv[4]);
    }
    else {
      lVar7 = std::chrono::_V2::steady_clock::now();
      if (local_f0.points_.rows_ != 0) {
        uVar6 = 0;
        do {
          hnsw::HNSWIndex::Insert(&local_f0,(index_t)uVar6);
          uVar6 = (ulong)((index_t)uVar6 + 1);
        } while (uVar6 < local_f0.points_.rows_);
      }
      lVar5 = std::chrono::_V2::steady_clock::now();
      printf("HNSW Build time: %ldms\n",(lVar5 - lVar7) / 1000000);
      printf("Top layer: %d\n",(ulong)(uint)local_f0.top_layer_);
      printf("Distance calculations: %ld\n",local_108.num);
      hnsw::HNSWIndex::SaveIndex(&local_f0,"index.bin");
    }
    local_138 = local_f0.super_Index._vptr_Index;
    local_140 = local_130;
    puts("Searching ...");
    local_f0.ef_search_ = 0x100;
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::vector(&local_120,__n,(allocator_type *)&local_168);
    local_148 = std::chrono::_V2::steady_clock::now();
    pfVar3 = local_170;
    if (__n != 0) {
      lVar7 = 0x10;
      uVar6 = 0;
      do {
        hnsw::HNSWIndex::Search(&local_168,&local_f0,local_17c,pfVar3 + local_178 * (int)uVar6);
        pvVar2 = *(void **)((long)local_120.
                                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x10);
        puVar1 = (undefined8 *)
                 ((long)local_120.
                        super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x10);
        *puVar1 = local_168.
                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar1[1] = local_168.
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&((local_120.
                   super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar7) =
             local_168.
             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_168.
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
        local_168.
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2);
        }
        if (local_168.
            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_168.
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x18;
      } while (__n != uVar6);
    }
    lVar7 = std::chrono::_V2::steady_clock::now();
    lVar7 = (lVar7 - local_148) / 1000;
    printf(anon_var_dwarf_b66e,lVar7 / (long)__n,lVar7 % (long)__n);
    puts("Evaluating ...");
    pp_Var4 = local_138;
    ComputeRecall(local_124,local_17c,(int *)local_138,&local_120);
    printf("Recall@100: %f\n");
    pfVar3 = local_140;
    if (pp_Var4 != (_func_int **)0x0) {
      operator_delete(pp_Var4);
    }
    if (pfVar3 != (float *)0x0) {
      operator_delete(pfVar3);
    }
    if (local_170 != (float *)0x0) {
      operator_delete(local_170);
    }
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::~vector(&local_120);
    hnsw::HNSWIndex::~HNSWIndex(&local_f0);
    return 0;
  }
  __assert_fail("num_gts == num_queries && \"#GT must be equal to #queries\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KinglittleQ[P]hnsw/tests/sift_test.cpp"
                ,0x20,"int main(int, char **)");
}

Assistant:

int main(int argc, char **argv) {
  float *base_data, *query_data;
  int *gt_data;
  uint32_t num_bases, num_queries, num_gts;
  int dim, K;

  assert(argc >= 4 && "Usage: sift_test dataset_path query_path groundtruth_path index_path");
  read_fvecs(argv[1], base_data, num_bases, dim);
  read_fvecs(argv[2], query_data, num_queries, dim);
  read_ivecs(argv[3], gt_data, num_gts, K);
  assert(num_gts == num_queries && "#GT must be equal to #queries");

  const uint32_t M = 32;
  const uint32_t ef_search = 256;
  const uint32_t ef_construction = 40;

  hnsw::L2Distance distance(dim);
  hnsw::HNSWIndex hnsw_index(base_data, num_bases, dim, distance, M, ef_construction);

  if (argc == 5) {
    hnsw_index.LoadIndex(argv[4]);
  } else {
    // Test build
    auto t0 = steady_clock::now();
    hnsw_index.Build();
    auto t1 = steady_clock::now();
    auto duration = duration_cast<milliseconds>(t1 - t0).count();
    printf("HNSW Build time: %ldms\n", duration);
    printf("Top layer: %d\n", hnsw_index.TopLayer());
    printf("Distance calculations: %ld\n", distance.num);

    hnsw_index.SaveIndex("index.bin");
  }

  printf("Searching ...\n");
  hnsw_index.SetEfSearch(ef_search);
  std::vector<PointSet> result(num_queries);
  auto t0 = steady_clock::now();
  for (uint32_t i = 0; i < num_queries; i++) {
    result[i] = hnsw_index.Search(K, &query_data[i * dim]);
  }
  auto t1 = steady_clock::now();
  auto duration = duration_cast<microseconds>(t1 - t0).count();
  printf("HNSW search speed: %ld µs/query\n", duration / num_queries);

  printf("Evaluating ...\n");
  double recall = ComputeRecall(num_queries, K, gt_data, result);
  printf("Recall@100: %f\n", recall);

  delete gt_data;
  delete base_data;
  delete query_data;

  return 0;
}